

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O0

void sigchld_handler(int signum,siginfo_t *handler_info,void *handler_context)

{
  int iVar1;
  int *piVar2;
  int in_EDI;
  int saved_errno;
  
  if ((old_sigaction.__sigaction_handler.sa_handler != (__sighandler_t)0x1) &&
     (old_sigaction.__sigaction_handler.sa_handler != (__sighandler_t)0x0)) {
    if ((old_sigaction.sa_flags & 4U) == 0) {
      (*old_sigaction.__sigaction_handler.sa_handler)(in_EDI);
    }
    else {
      (*old_sigaction.__sigaction_handler.sa_handler)(in_EDI);
    }
  }
  if (forkfd_status == 1) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    reapChildProcesses();
    piVar2 = __errno_location();
    *piVar2 = iVar1;
  }
  return;
}

Assistant:

static void sigchld_handler(int signum, siginfo_t *handler_info, void *handler_context)
{
    /*
     * This is a signal handler, so we need to be careful about which functions
     * we can call. See the full, official listing in the POSIX.1-2008
     * specification at:
     *   http://pubs.opengroup.org/onlinepubs/9699919799/functions/V2_chap02.html#tag_15_04_03
     *
     * The handler_info and handler_context parameters may not be valid, if
     * we're a chained handler from another handler that did not use
     * SA_SIGINFO. Therefore, we must obtain the siginfo ourselves directly by
     * calling waitid.
     *
     * But we pass them anyway. Let's call the chained handler first, while
     * those two arguments have a chance of being correct.
     */
    if (old_sigaction.sa_handler != SIG_IGN && old_sigaction.sa_handler != SIG_DFL) {
        if (old_sigaction.sa_flags & SA_SIGINFO)
            old_sigaction.sa_sigaction(signum, handler_info, handler_context);
        else
            old_sigaction.sa_handler(signum);
    }

    if (ffd_atomic_load(&forkfd_status, FFD_ATOMIC_RELAXED) == 1) {
        int saved_errno = errno;
        reapChildProcesses();
        errno = saved_errno;
    }
}